

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_check_interval_option
              (rtr_socket *rtr_socket,int interval_mode,uint32_t interval,rtr_interval_type type)

{
  long lVar1;
  long in_FS_OFFSET;
  int local_38;
  uint32_t local_34;
  int interv_retval;
  uint32_t maximum;
  uint16_t minimum;
  rtr_interval_type type_local;
  uint32_t interval_local;
  int interval_mode_local;
  rtr_socket *rtr_socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (type == RTR_INTERVAL_TYPE_EXPIRATION) {
    interv_retval._2_2_ = 600;
    local_34 = 0x2a300;
    local_38 = rtr_check_interval_range(interval,600,0x2a300);
  }
  else if (type == RTR_INTERVAL_TYPE_REFRESH) {
    interv_retval._2_2_ = 1;
    local_34 = 0x15180;
    local_38 = rtr_check_interval_range(interval,1,0x15180);
  }
  else {
    if (type != RTR_INTERVAL_TYPE_RETRY) {
      lrtr_dbg("RTR Socket: Invalid interval type: %u.",(ulong)type);
      rtr_socket_local._4_4_ = -1;
      goto LAB_0010d495;
    }
    interv_retval._2_2_ = 1;
    local_34 = 0x1c20;
    local_38 = rtr_check_interval_range(interval,1,0x1c20);
  }
  if ((local_38 == 0) || (interval_mode == 1)) {
    apply_interval_value(rtr_socket,interval,type);
  }
  else if (interval_mode == 2) {
    if (local_38 == -1) {
      apply_interval_value(rtr_socket,(uint)interv_retval._2_2_,type);
    }
    else {
      apply_interval_value(rtr_socket,local_34,type);
    }
  }
  else {
    lrtr_dbg("RTR Socket: Received expiration value out of range. Was %u. It will be ignored.",
             (ulong)interval);
  }
  rtr_socket_local._4_4_ = 0;
LAB_0010d495:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return rtr_socket_local._4_4_;
}

Assistant:

int rtr_check_interval_option(struct rtr_socket *rtr_socket, int interval_mode, uint32_t interval,
			      enum rtr_interval_type type)
{
	uint16_t minimum;
	uint32_t maximum;

	int interv_retval;

	switch (type) {
	case RTR_INTERVAL_TYPE_EXPIRATION:
		minimum = RTR_EXPIRATION_MIN;
		maximum = RTR_EXPIRATION_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	case RTR_INTERVAL_TYPE_REFRESH:
		minimum = RTR_REFRESH_MIN;
		maximum = RTR_REFRESH_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	case RTR_INTERVAL_TYPE_RETRY:
		minimum = RTR_RETRY_MIN;
		maximum = RTR_RETRY_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	default:
		RTR_DBG("Invalid interval type: %u.", type);
		return RTR_ERROR;
	}

	if (interv_retval == RTR_INSIDE_INTERVAL_RANGE || interval_mode == RTR_INTERVAL_MODE_ACCEPT_ANY) {
		apply_interval_value(rtr_socket, interval, type);
	} else if (interval_mode == RTR_INTERVAL_MODE_DEFAULT_MIN_MAX) {
		if (interv_retval == RTR_BELOW_INTERVAL_RANGE)
			apply_interval_value(rtr_socket, minimum, type);
		else
			apply_interval_value(rtr_socket, maximum, type);
	} else {
		RTR_DBG("Received expiration value out of range. Was %u. It will be ignored.", interval);
	}

	return RTR_SUCCESS;
}